

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Model * gvr::loadSTL(char *name,bool merge_double_vertices)

{
  undefined8 uVar1;
  byte bVar2;
  _Ios_Iostate __a;
  int iVar3;
  uint32_t uVar4;
  Mesh *pMVar5;
  byte in_SIL;
  _Ios_Openmode in_EDI;
  uint t2;
  uint t1;
  uint t0;
  Vector3f tnormal;
  uint32_t i;
  int vn;
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  vni;
  uint32_t n;
  Vector6d pose;
  istringstream in_1;
  string sheader;
  char header [81];
  bool has_campose;
  Vector3d Tc;
  Matrix33d Rc;
  ifstream in;
  Mesh *mesh;
  Mesh *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  uint in_stack_fffffffffffff98c;
  Mesh *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  uint in_stack_fffffffffffff99c;
  undefined4 in_stack_fffffffffffff9b8;
  uint in_stack_fffffffffffff9bc;
  Mesh *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  uint in_stack_fffffffffffff9cc;
  Mesh *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  uint in_stack_fffffffffffff9dc;
  uint local_598;
  uint local_594;
  uint local_590;
  uint local_580;
  uint local_57c;
  SVector<double,_3> local_540;
  SMatrix<double,_3,_3> local_528;
  SVector<double,_6> local_4e0;
  string local_4b0 [32];
  istringstream local_490 [391];
  allocator local_309;
  string local_308 [32];
  char local_2e8 [80];
  undefined1 local_298;
  byte local_291;
  SVector<double,_3> local_290;
  SMatrix<double,_3,_3> local_278;
  long local_220 [65];
  Mesh *local_18;
  byte local_9;
  _Ios_Openmode local_8;
  
  local_9 = in_SIL & 1;
  local_18 = (Mesh *)0x0;
  local_8 = in_EDI;
  std::ifstream::ifstream(local_220);
  uVar1 = *(undefined8 *)(local_220[0] + -0x18);
  __a = std::operator|(_S_failbit,_S_badbit);
  std::operator|(__a,_S_eofbit);
  std::ios::exceptions((int)local_220 + (int)uVar1);
  std::ifstream::open((char *)local_220,local_8);
  gmath::SMatrix<double,_3,_3>::SMatrix(&local_278);
  gmath::SVector<double,_3>::SVector(&local_290);
  local_291 = 0;
  std::istream::read((char *)local_220,(long)local_2e8);
  local_298 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,local_2e8,&local_309);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  iVar3 = std::__cxx11::string::compare((ulong)local_308,0,(char *)0x8);
  if (iVar3 == 0) {
    std::__cxx11::string::substr((ulong)local_4b0,(ulong)local_308);
    std::__cxx11::istringstream::istringstream(local_490,local_4b0,_S_in);
    std::__cxx11::string::~string(local_4b0);
    gmath::SVector<double,_6>::SVector(&local_4e0);
    gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff990,
                      (SVector<double,_6> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    bVar2 = std::ios::good();
    if ((bVar2 & 1) != 0) {
      gmath::getRotation((Vector6d *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      gmath::SMatrix<double,_3,_3>::operator=(&local_278,&local_528);
      gmath::getTranslation
                ((Vector6d *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      gmath::SVector<double,_3>::operator=(&local_290,&local_540);
      local_291 = 1;
    }
    std::__cxx11::istringstream::~istringstream(local_490);
  }
  std::__cxx11::string::~string(local_308);
  uVar4 = anon_unknown_1::stlReadUint32((ifstream *)in_stack_fffffffffffff980);
  pMVar5 = (Mesh *)operator_new(0xc0);
  Mesh::Mesh(in_stack_fffffffffffff980);
  local_18 = pMVar5;
  if ((local_291 & 1) != 0) {
    Model::setDefCameraRT
              ((Model *)in_stack_fffffffffffff990,
               (Matrix33d *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Vector3d *)in_stack_fffffffffffff980);
  }
  (*(local_18->super_PointCloud).super_Model._vptr_Model[9])(local_18,(ulong)(uVar4 * 3),0);
  (*(local_18->super_PointCloud).super_Model._vptr_Model[10])(local_18,(ulong)uVar4);
  std::
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  ::set((set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
         *)0x12e83b);
  local_57c = 0;
  for (local_580 = 0; local_580 < uVar4; local_580 = local_580 + 1) {
    anon_unknown_1::stlReadVector3f
              ((ifstream *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    if ((local_9 & 1) == 0) {
      local_594 = local_57c + 1;
      local_590 = local_57c;
      local_598 = local_57c + 2;
      local_57c = local_57c + 3;
      anon_unknown_1::stlReadVector3f
                ((ifstream *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      PointCloud::setVertex
                (&in_stack_fffffffffffff990->super_PointCloud,in_stack_fffffffffffff98c,
                 (Vector3f *)in_stack_fffffffffffff980);
      in_stack_fffffffffffff990 = local_18;
      in_stack_fffffffffffff99c = local_594;
      anon_unknown_1::stlReadVector3f((ifstream *)CONCAT44(local_594,in_stack_fffffffffffff998));
      PointCloud::setVertex
                (&in_stack_fffffffffffff990->super_PointCloud,in_stack_fffffffffffff98c,
                 (Vector3f *)in_stack_fffffffffffff980);
      in_stack_fffffffffffff980 = local_18;
      in_stack_fffffffffffff98c = local_598;
      anon_unknown_1::stlReadVector3f
                ((ifstream *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      PointCloud::setVertex
                (&in_stack_fffffffffffff990->super_PointCloud,in_stack_fffffffffffff98c,
                 (Vector3f *)in_stack_fffffffffffff980);
    }
    else {
      anon_unknown_1::stlReadVector3f
                ((ifstream *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      local_590 = anon_unknown_1::findOrStoreVertex
                            ((Mesh *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                             (set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                              *)in_stack_fffffffffffff9d0,
                             (int *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                             (Vector3f *)in_stack_fffffffffffff9c0,
                             (Vector3f *)
                             CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      in_stack_fffffffffffff9d0 = local_18;
      in_stack_fffffffffffff9dc = local_590;
      anon_unknown_1::stlReadVector3f
                ((ifstream *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      local_594 = anon_unknown_1::findOrStoreVertex
                            ((Mesh *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                             (set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                              *)in_stack_fffffffffffff9d0,
                             (int *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                             (Vector3f *)in_stack_fffffffffffff9c0,
                             (Vector3f *)
                             CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      in_stack_fffffffffffff9c0 = local_18;
      in_stack_fffffffffffff9cc = local_594;
      anon_unknown_1::stlReadVector3f
                ((ifstream *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      in_stack_fffffffffffff9bc =
           anon_unknown_1::findOrStoreVertex
                     ((Mesh *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                      (set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                       *)in_stack_fffffffffffff9d0,
                      (int *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                      (Vector3f *)in_stack_fffffffffffff9c0,
                      (Vector3f *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      local_598 = in_stack_fffffffffffff9bc;
    }
    Mesh::setTriangleIndex(local_18,local_580,local_590,local_594,local_598);
    std::istream::ignore((long)local_220);
    std::istream::ignore((long)local_220);
  }
  if (SBORROW4(local_57c,uVar4 * 3) != (int)(local_57c + uVar4 * -3) < 0) {
    (*(local_18->super_PointCloud).super_Model._vptr_Model[9])(local_18,(ulong)local_57c,0);
  }
  Mesh::recalculateNormals(in_stack_fffffffffffff9d0);
  std::
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  ::~set((set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
          *)0x12ebdf);
  std::ifstream::close();
  pMVar5 = local_18;
  std::ifstream::~ifstream(local_220);
  return (Model *)pMVar5;
}

Assistant:

Model *loadSTL(const char *name, bool merge_double_vertices)
{
  Mesh *mesh=0;

  // open file

  std::ifstream in;

  in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
  in.open(name, std::ios_base::binary);

  // read header

  gmath::Matrix33d Rc;
  gmath::Vector3d Tc;
  bool has_campose=false;

  {
    char header[81];

    in.read(header, 80);
    header[80]='\0';

    std::string sheader(header);

    if (sheader.compare(0, 8, "campose=") == 0)
    {
      std::istringstream in(sheader.substr(8));

      gmath::Vector6d pose;
      in >> pose;

      if (in.good())
      {
        Rc=gmath::getRotation(pose);
        Tc=gmath::getTranslation(pose);
        has_campose=true;
      }
    }
  }

  // read number of trinagles

  uint32_t n;
  n=stlReadUint32(in);

  try
  {
    // create mesh

    mesh=new Mesh();

    if (has_campose)
    {
      mesh->setDefCameraRT(Rc, Tc);
    }

    mesh->resizeVertexList(3*n, false, false);
    mesh->resizeTriangleList(n);

    std::set<VertexNormalIndex> vni;

    // read all triangles

    int vn=0;

    for (uint32_t i=0; i<n; i++)
    {
      // read triangle normal

      gmath::Vector3f tnormal=stlReadVector3f(in);

      // read vertices and either find a duplicate or add them

      unsigned int t0, t1, t2;

      if (merge_double_vertices)
      {
        t0=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t1=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t2=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
      }
      else
      {
        t0=vn++;
        t1=vn++;
        t2=vn++;

        mesh->setVertex(t0, stlReadVector3f(in));
        mesh->setVertex(t1, stlReadVector3f(in));
        mesh->setVertex(t2, stlReadVector3f(in));
      }

      // store triangle indices

      mesh->setTriangleIndex(i, t0, t1, t2);

      // skip padding

      in.ignore(1);
      in.ignore(1);
    }

    // reduce list of vertices

    if (vn < static_cast<int>(3*n))
    {
      mesh->resizeVertexList(vn, false, false);
    }

    // calculate per vertex normals

    mesh->recalculateNormals();
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  in.close();

  return mesh;
}